

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int UYVYToNV12(uint8_t *src_uyvy,int src_stride_uyvy,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_uv
              ,int dst_stride_uv,int width,int height)

{
  uint uVar1;
  void *__ptr;
  code *pcVar2;
  code *pcVar3;
  int iVar4;
  code *pcVar5;
  ulong __n;
  uint uVar6;
  void *__src;
  uint8_t *local_b8;
  ulong uVar7;
  
  if (height == 0 ||
      (width < 1 ||
      (dst_uv == (uint8_t *)0x0 || (dst_y == (uint8_t *)0x0 || src_uyvy == (uint8_t *)0x0)))) {
    return -1;
  }
  if (height < 0) {
    src_uyvy = src_uyvy + ~height * src_stride_uyvy;
    src_stride_uyvy = -src_stride_uyvy;
    height = -height;
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((width & 0xfU) == 0) {
    pcVar5 = SplitUVRow_SSE2;
  }
  else {
    pcVar5 = SplitUVRow_Any_SSE2;
  }
  if ((uVar1 & 0x20) == 0) {
    pcVar5 = SplitUVRow_C;
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((width & 0x1fU) == 0) {
    pcVar2 = SplitUVRow_AVX2;
  }
  else {
    pcVar2 = SplitUVRow_Any_AVX2;
  }
  if ((uVar1 >> 10 & 1) == 0) {
    pcVar2 = pcVar5;
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((width & 0xfU) == 0) {
    pcVar5 = InterpolateRow_SSSE3;
  }
  else {
    pcVar5 = InterpolateRow_Any_SSSE3;
  }
  if ((uVar1 & 0x40) == 0) {
    pcVar5 = InterpolateRow_C;
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  uVar6 = width + 1U & 0xfffffffe;
  uVar7 = (ulong)uVar6;
  if ((width & 0x1fU) == 0) {
    pcVar3 = InterpolateRow_AVX2;
  }
  else {
    pcVar3 = InterpolateRow_Any_AVX2;
  }
  if ((uVar1 >> 10 & 1) == 0) {
    pcVar3 = pcVar5;
  }
  __ptr = malloc((ulong)(uVar6 * 3 + 0x3f));
  __src = (void *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
  __n = (ulong)(uint)width;
  local_b8 = dst_uv;
  if (1 < (uint)height) {
    iVar4 = 0;
    do {
      (*pcVar2)(src_uyvy,(long)__src + uVar7,__src,uVar7);
      memcpy(dst_y,__src,__n);
      (*pcVar2)(src_uyvy + src_stride_uyvy,(void *)((long)__src + uVar7 * 2),__src,uVar7);
      memcpy(dst_y + dst_stride_y,__src,__n);
      (*pcVar3)(dst_uv,(long)__src + uVar7,uVar7,uVar7,0x80);
      src_uyvy = src_uyvy + src_stride_uyvy * 2;
      dst_y = dst_y + dst_stride_y * 2;
      dst_uv = dst_uv + dst_stride_uv;
      iVar4 = iVar4 + 2;
    } while (iVar4 < (int)(height - 1U));
    local_b8 = dst_uv;
    if ((height & 1U) == 0) goto LAB_0012d616;
  }
  (*pcVar2)(src_uyvy,local_b8,__src,uVar7);
  memcpy(dst_y,__src,__n);
LAB_0012d616:
  free(__ptr);
  return 0;
}

Assistant:

LIBYUV_API
int UYVYToNV12(const uint8_t* src_uyvy,
               int src_stride_uyvy,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_uv,
               int dst_stride_uv,
               int width,
               int height) {
  int y;
  int halfwidth = (width + 1) >> 1;
  void (*SplitUVRow)(const uint8_t* src_uv, uint8_t* dst_u, uint8_t* dst_v,
                     int width) = SplitUVRow_C;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  if (!src_uyvy || !dst_y || !dst_uv || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_uyvy = src_uyvy + (height - 1) * src_stride_uyvy;
    src_stride_uyvy = -src_stride_uyvy;
  }
#if defined(HAS_SPLITUVROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SplitUVRow = SplitUVRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_SSE2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    SplitUVRow = SplitUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SplitUVRow = SplitUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_NEON;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SplitUVRow = SplitUVRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      SplitUVRow = SplitUVRow_MMI;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SplitUVRow = SplitUVRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_MSA;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif

  {
    int awidth = halfwidth * 2;
    // row of y and 2 rows of uv
    align_buffer_64(rows, awidth * 3);

    for (y = 0; y < height - 1; y += 2) {
      // Split Y from UV.
      SplitUVRow(src_uyvy, rows + awidth, rows, awidth);
      memcpy(dst_y, rows, width);
      SplitUVRow(src_uyvy + src_stride_uyvy, rows + awidth * 2, rows, awidth);
      memcpy(dst_y + dst_stride_y, rows, width);
      InterpolateRow(dst_uv, rows + awidth, awidth, awidth, 128);
      src_uyvy += src_stride_uyvy * 2;
      dst_y += dst_stride_y * 2;
      dst_uv += dst_stride_uv;
    }
    if (height & 1) {
      // Split Y from UV.
      SplitUVRow(src_uyvy, dst_uv, rows, awidth);
      memcpy(dst_y, rows, width);
    }
    free_aligned_buffer_64(rows);
  }
  return 0;
}